

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmPipeConnection.cxx
# Opt level: O0

void __thiscall cmPipeConnection::Connect(cmPipeConnection *this,uv_stream_t *server)

{
  int iVar1;
  uv_pipe_s *puVar2;
  uv_loop_t *puVar3;
  uv_stream_t *puVar4;
  undefined1 local_28 [8];
  auto_pipe_t rejectPipe;
  uv_stream_t *server_local;
  cmPipeConnection *this_local;
  
  rejectPipe.super_auto_handle_<uv_pipe_s>.super_auto_handle_base_<uv_pipe_s>.handle =
       (uv_pipe_s *)server;
  puVar2 = auto_handle_::operator_cast_to_uv_pipe_s_((auto_handle_ *)&this->ClientPipe);
  if (puVar2 == (uv_pipe_s *)0x0) {
    puVar3 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
    auto_pipe_t::init(&this->ClientPipe,(EVP_PKEY_CTX *)puVar3);
    puVar2 = rejectPipe.super_auto_handle_<uv_pipe_s>.super_auto_handle_base_<uv_pipe_s>.handle;
    puVar4 = auto_pipe_t::operator_cast_to_uv_stream_s_(&this->ClientPipe);
    iVar1 = uv_accept((uv_stream_t *)puVar2,puVar4);
    if (iVar1 == 0) {
      puVar4 = auto_pipe_t::operator_cast_to_uv_stream_s_(&this->ClientPipe);
      (this->super_cmEventBasedConnection).ReadStream = puVar4;
      puVar4 = auto_pipe_t::operator_cast_to_uv_stream_s_(&this->ClientPipe);
      (this->super_cmEventBasedConnection).WriteStream = puVar4;
      uv_read_start((this->super_cmEventBasedConnection).ReadStream,
                    cmEventBasedConnection::on_alloc_buffer,cmEventBasedConnection::on_read);
      (*((this->super_cmEventBasedConnection).super_cmConnection.Server)->_vptr_cmServerBase[4])();
    }
    else {
      auto_handle_base_<uv_pipe_s>::reset((auto_handle_base_<uv_pipe_s> *)&this->ClientPipe);
    }
  }
  else {
    auto_pipe_t::auto_pipe_t((auto_pipe_t *)local_28);
    puVar3 = cmServerBase::GetLoop((this->super_cmEventBasedConnection).super_cmConnection.Server);
    auto_pipe_t::init((auto_pipe_t *)local_28,(EVP_PKEY_CTX *)puVar3);
    puVar2 = rejectPipe.super_auto_handle_<uv_pipe_s>.super_auto_handle_base_<uv_pipe_s>.handle;
    puVar4 = auto_pipe_t::operator_cast_to_uv_stream_s_((auto_pipe_t *)local_28);
    uv_accept((uv_stream_t *)puVar2,puVar4);
    auto_pipe_t::~auto_pipe_t((auto_pipe_t *)local_28);
  }
  return;
}

Assistant:

void cmPipeConnection::Connect(uv_stream_t* server)
{
  if ((uv_pipe_t*)this->ClientPipe) {
    // Accept and close all pipes but the first:
    auto_pipe_t rejectPipe;

    rejectPipe.init(*this->Server->GetLoop(), 0);
    uv_accept(server, rejectPipe);

    return;
  }

  this->ClientPipe.init(*this->Server->GetLoop(), 0,
                        static_cast<cmEventBasedConnection*>(this));

  if (uv_accept(server, this->ClientPipe) != 0) {
    this->ClientPipe.reset();
    return;
  }
  this->ReadStream = this->ClientPipe;
  this->WriteStream = this->ClientPipe;

  uv_read_start(this->ReadStream, on_alloc_buffer, on_read);
  Server->OnConnected(this);
}